

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void mi_debug_show_arenas(void)

{
  mi_arena_t *pmVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  size_t field_count;
  char *pcVar5;
  mi_arena_t **ppmVar6;
  long lVar7;
  bool bVar8;
  
  if (mi_arena_count == 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = mi_arena_count - 1;
    ppmVar6 = mi_arenas;
    lVar3 = 0;
    lVar7 = 0;
    do {
      pmVar1 = *ppmVar6;
      if (pmVar1 != (mi_arena_t *)0x0) {
        field_count = pmVar1->field_count;
        pcVar5 = "";
        if ((pmVar1->memid).is_pinned != false) {
          pcVar5 = ", pinned";
        }
        _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n",lVar7,
                    pmVar1->block_count,0x20,field_count,pcVar5);
        sVar2 = mi_debug_show_bitmap
                          ("inuse blocks",(char *)pmVar1->block_count,(size_t)pmVar1->blocks_inuse,
                           (mi_bitmap_field_t *)pmVar1->field_count,field_count);
        lVar3 = lVar3 + sVar2;
        if (pmVar1->blocks_committed != (mi_bitmap_field_t *)0x0) {
          mi_debug_show_bitmap
                    ("committed blocks",(char *)pmVar1->block_count,(size_t)pmVar1->blocks_committed
                     ,(mi_bitmap_field_t *)pmVar1->field_count,field_count);
        }
      }
      if (pmVar1 == (mi_arena_t *)0x0) break;
      ppmVar6 = ppmVar6 + 1;
      bVar8 = lVar4 != lVar7;
      lVar7 = lVar7 + 1;
    } while (bVar8);
  }
  _mi_message("total inuse blocks    : %zu\n",lVar3);
  return;
}

Assistant:

void mi_debug_show_arenas(void) mi_attr_noexcept {
  const bool show_inuse = true;
  size_t max_arenas = mi_atomic_load_relaxed(&mi_arena_count);
  size_t inuse_total = 0;
  //size_t abandoned_total = 0;
  //size_t purge_total = 0;
  for (size_t i = 0; i < max_arenas; i++) {
    mi_arena_t* arena = mi_atomic_load_ptr_relaxed(mi_arena_t, &mi_arenas[i]);
    if (arena == NULL) break;
    _mi_message("arena %zu: %zu blocks of size %zuMiB (in %zu fields) %s\n", i, arena->block_count, MI_ARENA_BLOCK_SIZE / MI_MiB, arena->field_count, (arena->memid.is_pinned ? ", pinned" : ""));
    if (show_inuse) {
      inuse_total += mi_debug_show_bitmap("  ", "inuse blocks", arena->block_count, arena->blocks_inuse, arena->field_count);
    }
    if (arena->blocks_committed != NULL) {
      mi_debug_show_bitmap("  ", "committed blocks", arena->block_count, arena->blocks_committed, arena->field_count);
    }
    //if (show_abandoned) {
    //  abandoned_total += mi_debug_show_bitmap("  ", "abandoned blocks", arena->block_count, arena->blocks_abandoned, arena->field_count);
    //}
    //if (show_purge && arena->blocks_purge != NULL) {
    //  purge_total += mi_debug_show_bitmap("  ", "purgeable blocks", arena->block_count, arena->blocks_purge, arena->field_count);
    //}
  }
  if (show_inuse)     _mi_message("total inuse blocks    : %zu\n", inuse_total);
  //if (show_abandoned) _mi_message("total abandoned blocks: %zu\n", abandoned_total);
  //if (show_purge)     _mi_message("total purgeable blocks: %zu\n", purge_total);
}